

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::write_pointer<unsigned_long>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,unsigned_long value,
          format_specs *specs)

{
  pointer_writer<unsigned_long> pw;
  format_specs specs_copy;
  pointer_writer<unsigned_long> local_48;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_38;
  ulong uStack_30;
  wchar_t local_28 [4];
  
  local_48.num_digits = count_digits<4u,unsigned_long>(value);
  local_48.value = value;
  if (specs == (format_specs *)0x0) {
    local_38 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         (&this->out_,(ulong)(local_48.num_digits + 2));
    basic_writer<fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>::operator()
              ((pointer_writer<unsigned_long> *)&local_48,&local_38);
  }
  else {
    local_38 = *(checked_ptr<typename_buffer<wchar_t>::value_type> *)specs;
    uStack_30._0_1_ = specs->type;
    uStack_30._1_3_ = *(undefined3 *)&specs->field_0x9;
    uStack_30._4_4_ = (specs->fill).data_[0];
    local_28._0_8_ = *(undefined8 *)((specs->fill).data_ + 1);
    local_28._8_8_ = *(undefined8 *)((specs->fill).data_ + 3);
    if ((uStack_30 & 0xf00) == 0) {
      uStack_30 = uStack_30 | 0x200;
    }
    basic_writer<fmt::v6::buffer_range<wchar_t>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>&>
              ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this,(format_specs *)&local_38,
               &local_48);
  }
  return;
}

Assistant:

void write_pointer(UIntPtr value, const format_specs* specs) {
    int num_digits = count_digits<4>(value);
    auto pw = pointer_writer<UIntPtr>{value, num_digits};
    if (!specs) return pw(reserve(to_unsigned(num_digits) + 2));
    format_specs specs_copy = *specs;
    if (specs_copy.align == align::none) specs_copy.align = align::right;
    write_padded(specs_copy, pw);
  }